

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O2

int pt_evt_decode_psb(pt_event_decoder *decoder)

{
  pt_event_queue *evq;
  anon_union_16_19_41f219a3_for_payload *packet;
  pt_time *time;
  pt_time_cal *tcal;
  uint8_t *packet_00;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  pt_exec_mode pVar5;
  pt_event *ppVar6;
  pt_event *ppVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  pt_packet local_170;
  pt_packet_decoder pacdec;
  
  evq = &decoder->evq;
  iVar2 = pt_evq_pending(evq,0xffffffff);
  if (iVar2 != 0) {
    return -6;
  }
  pt_last_ip_init(&decoder->ip);
  decoder->field_0x72c = decoder->field_0x72c & 0xef;
  ppVar6 = pt_evq_enqueue(evq,1);
  if (ppVar6 == (pt_event *)0x0) {
    return -9;
  }
  ppVar6->field_0x4 = ppVar6->field_0x4 | 2;
  packet = &(decoder->packet).payload;
  time = &decoder->time;
  tcal = &decoder->tcal;
  packet_00 = &(decoder->packet).payload.cfe.vector;
  do {
    pt_evt_fetch_packet(decoder);
    uVar3 = 0;
    switch((decoder->packet).type) {
    case ppt_invalid:
      uVar3 = decoder->status;
      break;
    default:
      return -6;
    case ppt_pad:
      break;
    case ppt_psbend:
      if ((decoder->field_0x72c & 0x10) == 0) {
        ppVar6->type = ptev_disabled;
        ppVar6->field_0x4 = ppVar6->field_0x4 | 1;
        return 1;
      }
      goto LAB_001071de;
    case ppt_fup:
      bVar10 = (decoder->packet).payload.ip.ipc != pt_ipc_suppressed;
      if ((undefined1  [64])
          ((undefined1  [64])(decoder->pacdec).config.errata & (undefined1  [64])0x1) !=
          (undefined1  [64])0x0) {
        memcpy(&pacdec,decoder,0x128);
        do {
          iVar2 = pt_pkt_next(&pacdec,&local_170,0x18);
          if (iVar2 < 0) {
            if (iVar2 != -7) {
              return iVar2;
            }
            goto LAB_00107042;
          }
          if (ppt_mnt < local_170.type) goto LAB_00107042;
        } while ((0x27f814U >> (local_170.type & (ppt_evd|ppt_psb)) & 1) != 0);
        if (local_170.type == ppt_tip_pge) {
          bVar10 = false;
        }
      }
LAB_00107042:
      decoder->field_0x72c = decoder->field_0x72c & 0xef | bVar10 << 4;
      uVar3 = 0;
      if (bVar10 != false) {
        uVar3 = pt_last_ip_update_ip(&decoder->ip,&packet->ip,(pt_config *)decoder);
      }
      break;
    case ppt_mode:
      if ((packet->ip).ipc == 0x20) {
        ppVar7 = pt_evq_enqueue(evq,1);
        if (ppVar7 == (pt_event *)0x0) {
          return -9;
        }
        ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
        ppVar7->type = ptev_tsx;
        bVar9 = *packet_00;
        bVar1 = (ppVar7->variant).ptwrite.size;
        (ppVar7->variant).ptwrite.size = bVar1 & 0xfe | bVar9 & 1;
        bVar8 = *packet_00 & 2;
        bVar9 = bVar1 & 0xfc | bVar9 & 1;
        goto LAB_001070b4;
      }
      uVar3 = 0;
      if ((packet->ip).ipc == pt_ipc_suppressed) {
        bVar8 = decoder->field_0x72c;
        if ((bVar8 & 1) == 0) {
          bVar9 = (decoder->packet).payload.cfe.vector;
          decoder->field_0x72c =
               ((bVar9 & 1) << 3 | bVar9 * '\x02' & 4 | bVar8 & 0xf0 | bVar9 >> 1 & 2) + 1;
        }
        else {
          if ((undefined1  [16])((undefined1  [16])(decoder->flags).variant & (undefined1  [16])0x2)
              == (undefined1  [16])0x0) {
            bVar9 = *packet_00;
          }
          else {
            bVar9 = *packet_00;
            if (((bVar9 >> 2 ^ bVar8 >> 1) & 1) != 0) {
              return -0x16;
            }
          }
          if ((((bVar9 >> 1 ^ bVar8 >> 2) & 1) != 0) || (((bVar9 ^ bVar8 >> 3) & 1) != 0)) {
            return -0x16;
          }
        }
        ppVar7 = pt_evq_enqueue(evq,1);
        if (ppVar7 == (pt_event *)0x0) {
          return -9;
        }
        ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
        ppVar7->type = ptev_exec_mode;
        pVar5 = pt_get_exec_mode((pt_packet_mode_exec *)packet_00);
        (ppVar7->variant).exec_mode.mode = pVar5;
        uVar3 = 0;
        if ((undefined1  [16])((undefined1  [16])(decoder->flags).variant & (undefined1  [16])0x2)
            != (undefined1  [16])0x0) {
          ppVar7 = pt_evq_enqueue(evq,1);
          if (ppVar7 == (pt_event *)0x0) {
            return -9;
          }
          ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
          ppVar7->type = ptev_iflags;
          (ppVar7->variant).pwre.state = (ppVar7->variant).pwre.state & 0xfe | *packet_00 >> 2 & 1;
          goto LAB_001070b9;
        }
      }
      break;
    case ppt_pip:
      ppVar7 = pt_evq_enqueue(evq,1);
      if (ppVar7 == (pt_event *)0x0) {
        return -9;
      }
      ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
      ppVar7->type = ptev_async_paging;
      (ppVar7->variant).enabled.ip = (uint64_t)(decoder->packet).payload.mode;
      bVar8 = (decoder->packet).payload.ptw.plc & 1;
      bVar9 = (ppVar7->variant).ptwrite.size & 0xfe;
LAB_001070b4:
      (ppVar7->variant).ptwrite.size = bVar9 | bVar8;
      goto LAB_001070b9;
    case ppt_vmcs:
      ppVar7 = pt_evq_enqueue(evq,1);
      if (ppVar7 == (pt_event *)0x0) {
        return -9;
      }
      ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
      ppVar7->type = ptev_async_vmcs;
      goto LAB_0010702c;
    case ppt_cbr:
      iVar2 = pt_tcal_header_cbr(tcal,&packet->cbr,(pt_config *)decoder);
      if (iVar2 < 0 && iVar2 != -10) {
        return iVar2;
      }
      iVar2 = pt_time_update_cbr(time,&packet->cbr,(pt_config *)decoder);
      if (iVar2 != -10 && iVar2 < 0) {
        return iVar2;
      }
      ppVar7 = pt_evq_enqueue(evq,1);
      if (ppVar7 == (pt_event *)0x0) {
        return -9;
      }
      ppVar7->field_0x4 = ppVar7->field_0x4 | 2;
      ppVar7->type = ptev_cbr;
      *(ushort *)&ppVar7->variant = (ushort)(packet->tnt).bit_size;
      goto LAB_001070b9;
    case ppt_tsc:
      iVar2 = pt_tcal_header_tsc(tcal,&packet->tsc,(pt_config *)decoder);
      if (iVar2 < 0 && iVar2 != -10) {
        return iVar2;
      }
      uVar4 = pt_time_update_tsc(time,&packet->tsc,(pt_config *)decoder);
      uVar3 = (int)uVar4 >> 0x1f & uVar4;
      if (uVar4 == 0xfffffff6) {
        uVar3 = 0;
      }
      break;
    case ppt_tma:
      uVar3 = pt_evt_apply_tma(time,tcal,&packet->tma,(pt_config *)decoder);
      break;
    case ppt_mtc:
      uVar3 = pt_evt_apply_mtc(time,tcal,&packet->mtc,(pt_config *)decoder);
      break;
    case ppt_cyc:
      uVar3 = pt_evt_apply_cyc(time,tcal,&packet->cyc,(pt_config *)decoder);
      break;
    case ppt_ovf:
      if ((decoder->field_0x72c & 0x10) == 0) {
        ppVar7 = pt_evq_dequeue(evq,1);
        if (ppVar7 == ppVar6) {
          return 1;
        }
        return -1;
      }
LAB_001071de:
      ppVar6->type = ptev_enabled;
      return 1;
    case ppt_mnt:
      ppVar7 = pt_evq_enqueue(evq,1);
      if (ppVar7 == (pt_event *)0x0) {
        return -9;
      }
      ppVar7->type = ptev_mnt;
LAB_0010702c:
      (ppVar7->variant).disabled.ip = (uint64_t)packet->mode;
LAB_001070b9:
      uVar3 = 0;
    }
    if ((int)uVar3 < 0) {
      return uVar3;
    }
  } while( true );
}

Assistant:

static int pt_evt_decode_psb(struct pt_event_decoder *decoder)
{
	const struct pt_packet *packet;
	struct pt_event *ev;
	int errcode;

	if (!decoder)
		return -pte_internal;

	/* We must not carry partial events across PSB. */
	if (pt_evq_pending(&decoder->evq, UINT32_MAX))
		return -pte_bad_context;

	pt_last_ip_init(&decoder->ip);
	decoder->enabled = 0;

	/* Create an event that will represent the enabled/disabled status.
	 *
	 * We do not know the status, yet, but we want the event to be first.
	 * We will fill in the details when we reach PSBEND.
	 */
	ev = pt_evq_enqueue(&decoder->evq, evb_psbend);
	if (!ev)
		return -pte_nomem;

	ev->status_update = 1;

	packet = &decoder->packet;
	for (;;) {
		errcode = pt_evt_fetch_packet(decoder);
		if (errcode < 0)
			return errcode;

		switch (packet->type) {
		case ppt_fup:
			errcode = pt_evt_header_fup(decoder,
						    &packet->payload.ip);
			break;

		case ppt_mode:
			errcode = pt_evt_header_mode(decoder,
						     &packet->payload.mode);
			break;

		case ppt_pip:
			errcode = pt_evt_header_pip(decoder,
						    &packet->payload.pip);
			break;

		case ppt_vmcs:
			errcode = pt_evt_header_vmcs(decoder,
						     &packet->payload.vmcs);
			break;

		case ppt_mnt:
			errcode = pt_evt_header_mnt(decoder,
						    &packet->payload.mnt);
			break;

		case ppt_tsc:
			errcode = pt_evt_header_tsc(decoder,
						    &packet->payload.tsc);
			break;

		case ppt_cbr:
			errcode = pt_evt_header_cbr(decoder,
						    &packet->payload.cbr);
			break;

		case ppt_tma:
			errcode = pt_evt_header_tma(decoder,
						    &packet->payload.tma);
			break;

		case ppt_mtc:
			errcode = pt_evt_header_mtc(decoder,
						    &packet->payload.mtc);
			break;

		case ppt_cyc:
			errcode = pt_evt_header_cyc(decoder,
						    &packet->payload.cyc);
			break;

		case ppt_psbend:
			if (decoder->enabled)
				ev->type = ptev_enabled;
			else {
				ev->type = ptev_disabled;
				ev->ip_suppressed = 1;
			}

			return 1;

		case ppt_ovf: {
			/* When PSB+ ends with an OVF, we remove the event we
			 * created initially if tracing is not enabled.
			 *
			 * We may have lost the FUP and end up with an invalid
			 * status update that might be diagnosed before we
			 * reach the overflow event.
			 */
			if (decoder->enabled)
				ev->type = ptev_enabled;
			else {
				const struct pt_event *head;

				head = pt_evq_dequeue(&decoder->evq,
						      evb_psbend);
				if (head != ev)
					return -pte_internal;
			}

			return 1;
		}

		case ppt_pad:
			break;

		case ppt_invalid:
			errcode = decoder->status;
			break;

		default:
			errcode = -pte_bad_context;
			break;
		}

		if (errcode < 0)
			return errcode;
	}
}